

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  EnumGenerator *pEVar1;
  MessageGenerator *this_00;
  int i_1;
  long lVar2;
  FileDescriptor *pFVar3;
  int i;
  long lVar4;
  EnumGenerator *generator;
  string *local_58;
  vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  *local_50;
  vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  *local_48;
  Options *local_40;
  vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  *local_38;
  
  this->file_ = file;
  local_58 = &this->root_class_name_;
  FileClassName_abi_cxx11_(local_58,(objectivec *)file,(FileDescriptor *)options);
  local_38 = &this->enum_generators_;
  local_48 = &this->message_generators_;
  local_50 = &this->extension_generators_;
  local_40 = &this->options_;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->message_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Options::Options(local_40,options);
  lVar2 = 0;
  for (lVar4 = 0; pFVar3 = this->file_, lVar4 < *(int *)(pFVar3 + 0x68); lVar4 = lVar4 + 1) {
    pEVar1 = (EnumGenerator *)operator_new(0x58);
    EnumGenerator::EnumGenerator(pEVar1,(EnumDescriptor *)(*(long *)(pFVar3 + 0x70) + lVar2));
    generator = pEVar1;
    std::
    vector<google::protobuf::compiler::objectivec::EnumGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::EnumGenerator_*>_>
    ::push_back(local_38,&generator);
    lVar2 = lVar2 + 0x38;
  }
  lVar4 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(pFVar3 + 0x58); lVar2 = lVar2 + 1) {
    this_00 = (MessageGenerator *)operator_new(0xe0);
    MessageGenerator::MessageGenerator
              (this_00,local_58,(Descriptor *)(*(long *)(pFVar3 + 0x60) + lVar4),local_40);
    generator = (EnumGenerator *)this_00;
    std::
    vector<google::protobuf::compiler::objectivec::MessageGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::MessageGenerator_*>_>
    ::push_back(local_48,(value_type *)&generator);
    pFVar3 = this->file_;
    lVar4 = lVar4 + 0xa8;
  }
  lVar4 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(pFVar3 + 0x88); lVar2 = lVar2 + 1) {
    pEVar1 = (EnumGenerator *)operator_new(0x48);
    ExtensionGenerator::ExtensionGenerator
              ((ExtensionGenerator *)pEVar1,local_58,
               (FieldDescriptor *)(*(long *)(pFVar3 + 0x98) + lVar4));
    generator = pEVar1;
    std::
    vector<google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::objectivec::ExtensionGenerator_*>_>
    ::push_back(local_50,(value_type *)&generator);
    pFVar3 = this->file_;
    lVar4 = lVar4 + 0xa8;
  }
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor *file, const Options& options)
    : file_(file),
      root_class_name_(FileClassName(file)),
      options_(options) {
  for (int i = 0; i < file_->enum_type_count(); i++) {
    EnumGenerator *generator = new EnumGenerator(file_->enum_type(i));
    enum_generators_.push_back(generator);
  }
  for (int i = 0; i < file_->message_type_count(); i++) {
    MessageGenerator *generator =
        new MessageGenerator(root_class_name_, file_->message_type(i), options_);
    message_generators_.push_back(generator);
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    ExtensionGenerator *generator =
        new ExtensionGenerator(root_class_name_, file_->extension(i));
    extension_generators_.push_back(generator);
  }
}